

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O2

int32_t __thiscall
webrtc::TraceImpl::AddModuleAndId(TraceImpl *this,char *trace_message,TraceModule module,int32_t id)

{
  char *pcVar1;
  
  if (id == -1) {
    switch(module) {
    case kTraceUndefined:
      goto switchD_0018fa22_caseD_0;
    case kTraceVoice:
      pcVar1 = "       VOICE:%11ld;";
      break;
    case kTraceVideo:
      pcVar1 = "       VIDEO:%11ld;";
      break;
    case kTraceUtility:
      pcVar1 = "     UTILITY:%11ld;";
      break;
    case kTraceRtpRtcp:
      pcVar1 = "    RTP/RTCP:%11ld;";
      break;
    case kTraceTransport:
      pcVar1 = "   TRANSPORT:%11ld;";
      break;
    case kTraceSrtp:
      pcVar1 = "        SRTP:%11ld;";
      break;
    case kTraceAudioCoding:
      pcVar1 = "AUDIO CODING:%11ld;";
      break;
    case kTraceAudioMixerServer:
      pcVar1 = " AUDIO MIX/S:%11ld;";
      break;
    case kTraceAudioMixerClient:
      pcVar1 = " AUDIO MIX/C:%11ld;";
      break;
    case kTraceFile:
      pcVar1 = "        FILE:%11ld;";
      break;
    case kTraceAudioProcessing:
      pcVar1 = "  AUDIO PROC:%11ld;";
      break;
    default:
      goto switchD_0018fa22_caseD_c;
    case kTraceVideoCoding:
      pcVar1 = "VIDEO CODING:%11ld;";
      break;
    case kTraceVideoMixer:
      pcVar1 = "   VIDEO MIX:%11ld;";
      break;
    case kTraceAudioDevice:
      pcVar1 = "AUDIO DEVICE:%11ld;";
      break;
    case kTraceVideoRenderer:
      pcVar1 = "VIDEO RENDER:%11ld;";
      break;
    case kTraceVideoCapture:
      pcVar1 = "VIDEO CAPTUR:%11ld;";
      break;
    case kTraceRemoteBitrateEstimator:
      pcVar1 = "     BWE RBE:%11ld;";
    }
    sprintf(trace_message,pcVar1,0xffffffffffffffff);
  }
  else {
    if (kTraceRemoteBitrateEstimator < module) {
      return 0x19;
    }
    switch(module) {
    case kTraceUndefined:
switchD_0018fa22_caseD_0:
      builtin_strncpy(trace_message,"                         ",0x1a);
      return 0x19;
    case kTraceVoice:
      pcVar1 = "       VOICE:%5ld %5ld;";
      break;
    case kTraceVideo:
      pcVar1 = "       VIDEO:%5ld %5ld;";
      break;
    case kTraceUtility:
      pcVar1 = "     UTILITY:%5ld %5ld;";
      break;
    case kTraceRtpRtcp:
      pcVar1 = "    RTP/RTCP:%5ld %5ld;";
      break;
    case kTraceTransport:
      pcVar1 = "   TRANSPORT:%5ld %5ld;";
      break;
    case kTraceSrtp:
      pcVar1 = "        SRTP:%5ld %5ld;";
      break;
    case kTraceAudioCoding:
      pcVar1 = "AUDIO CODING:%5ld %5ld;";
      break;
    case kTraceAudioMixerServer:
      pcVar1 = " AUDIO MIX/S:%5ld %5ld;";
      break;
    case kTraceAudioMixerClient:
      pcVar1 = " AUDIO MIX/C:%5ld %5ld;";
      break;
    case kTraceFile:
      pcVar1 = "        FILE:%5ld %5ld;";
      break;
    case kTraceAudioProcessing:
      pcVar1 = "  AUDIO PROC:%5ld %5ld;";
      break;
    default:
      goto switchD_0018fa22_caseD_c;
    case kTraceVideoCoding:
      pcVar1 = "VIDEO CODING:%5ld %5ld;";
      break;
    case kTraceVideoMixer:
      pcVar1 = "   VIDEO MIX:%5ld %5ld;";
      break;
    case kTraceAudioDevice:
      pcVar1 = "AUDIO DEVICE:%5ld %5ld;";
      break;
    case kTraceVideoRenderer:
      pcVar1 = "VIDEO RENDER:%5ld %5ld;";
      break;
    case kTraceVideoCapture:
      pcVar1 = "VIDEO CAPTUR:%5ld %5ld;";
      break;
    case kTraceRemoteBitrateEstimator:
      pcVar1 = "     BWE RBE:%5ld %5ld;";
    }
    sprintf(trace_message,pcVar1,(long)(id >> 0x10),(ulong)(ushort)id);
  }
switchD_0018fa22_caseD_c:
  return 0x19;
}

Assistant:

int32_t TraceImpl::AddModuleAndId(char* trace_message,
                                  const TraceModule module,
                                  const int32_t id) const {
  // Use long int to prevent problems with different definitions of
  // int32_t.
  // TODO(hellner): is this actually a problem? If so, it should be better to
  //                clean up int32_t
  const long int idl = id;
  const int kMessageLength = 25;
  if (idl != -1) {
    const unsigned long int id_engine = id >> 16;
    const unsigned long int id_channel = id & 0xffff;

    switch (module) {
      case kTraceUndefined:
        // Add the appropriate amount of whitespace.
        memset(trace_message, ' ', kMessageLength);
        trace_message[kMessageLength] = '\0';
        break;
      case kTraceVoice:
        sprintf(trace_message, "       VOICE:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceVideo:
        sprintf(trace_message, "       VIDEO:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceUtility:
        sprintf(trace_message, "     UTILITY:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceRtpRtcp:
        sprintf(trace_message, "    RTP/RTCP:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceTransport:
        sprintf(trace_message, "   TRANSPORT:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceAudioCoding:
        sprintf(trace_message, "AUDIO CODING:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceSrtp:
        sprintf(trace_message, "        SRTP:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceAudioMixerServer:
        sprintf(trace_message, " AUDIO MIX/S:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceAudioMixerClient:
        sprintf(trace_message, " AUDIO MIX/C:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceVideoCoding:
        sprintf(trace_message, "VIDEO CODING:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceVideoMixer:
        // Print sleep time and API call
        sprintf(trace_message, "   VIDEO MIX:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceFile:
        sprintf(trace_message, "        FILE:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceAudioProcessing:
        sprintf(trace_message, "  AUDIO PROC:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceAudioDevice:
        sprintf(trace_message, "AUDIO DEVICE:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceVideoRenderer:
        sprintf(trace_message, "VIDEO RENDER:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceVideoCapture:
        sprintf(trace_message, "VIDEO CAPTUR:%5ld %5ld;", id_engine,
                id_channel);
        break;
      case kTraceRemoteBitrateEstimator:
        sprintf(trace_message, "     BWE RBE:%5ld %5ld;", id_engine,
                id_channel);
        break;
    }
  } else {
    switch (module) {
      case kTraceUndefined:
        // Add the appropriate amount of whitespace.
        memset(trace_message, ' ', kMessageLength);
        trace_message[kMessageLength] = '\0';
        break;
      case kTraceVoice:
        sprintf(trace_message, "       VOICE:%11ld;", idl);
        break;
      case kTraceVideo:
        sprintf(trace_message, "       VIDEO:%11ld;", idl);
        break;
      case kTraceUtility:
        sprintf(trace_message, "     UTILITY:%11ld;", idl);
        break;
      case kTraceRtpRtcp:
        sprintf(trace_message, "    RTP/RTCP:%11ld;", idl);
        break;
      case kTraceTransport:
        sprintf(trace_message, "   TRANSPORT:%11ld;", idl);
        break;
      case kTraceAudioCoding:
        sprintf(trace_message, "AUDIO CODING:%11ld;", idl);
        break;
      case kTraceSrtp:
        sprintf(trace_message, "        SRTP:%11ld;", idl);
        break;
      case kTraceAudioMixerServer:
        sprintf(trace_message, " AUDIO MIX/S:%11ld;", idl);
        break;
      case kTraceAudioMixerClient:
        sprintf(trace_message, " AUDIO MIX/C:%11ld;", idl);
        break;
      case kTraceVideoCoding:
        sprintf(trace_message, "VIDEO CODING:%11ld;", idl);
        break;
      case kTraceVideoMixer:
        sprintf(trace_message, "   VIDEO MIX:%11ld;", idl);
        break;
      case kTraceFile:
        sprintf(trace_message, "        FILE:%11ld;", idl);
        break;
      case kTraceAudioProcessing:
        sprintf(trace_message, "  AUDIO PROC:%11ld;", idl);
        break;
      case kTraceAudioDevice:
        sprintf(trace_message, "AUDIO DEVICE:%11ld;", idl);
        break;
      case kTraceVideoRenderer:
        sprintf(trace_message, "VIDEO RENDER:%11ld;", idl);
        break;
      case kTraceVideoCapture:
        sprintf(trace_message, "VIDEO CAPTUR:%11ld;", idl);
        break;
      case kTraceRemoteBitrateEstimator:
        sprintf(trace_message, "     BWE RBE:%11ld;", idl);
        break;
    }
  }
  return kMessageLength;
}